

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                 (UnknownFieldLiteParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  long lVar5;
  byte *unaff_R15;
  bool bVar6;
  pair<const_char_*,_bool> pVar7;
  
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar7._8_8_ = 0;
      pVar7.first = ptr;
    }
    else {
      pVar7._8_8_ = 1;
      pVar7.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar7 = EpsCopyInputStream::DoneFallback
                          (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    pbVar4 = (byte *)pVar7.first;
    if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)pbVar4;
    }
    bVar1 = *pbVar4;
    ptr = (char *)(pbVar4 + 1);
    uVar2 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar3 = ((uint)(byte)*ptr * 0x80 + (uint)bVar1) - 0x80;
      if (*ptr < '\0') {
        lVar5 = -0x15;
        pbVar4 = pbVar4 + 3;
        do {
          ptr = (char *)pbVar4;
          uVar3 = (((byte *)ptr)[-1] - 1 << ((char)lVar5 + 0x23U & 0x1f)) + uVar3;
          uVar2 = uVar3;
          if (-1 < (char)((byte *)ptr)[-1]) break;
          pbVar4 = (byte *)ptr + 1;
          ptr = (char *)0x0;
          lVar5 = lVar5 + 7;
          uVar2 = 0;
        } while (lVar5 != 0);
      }
      else {
        ptr = (char *)(pbVar4 + 2);
        uVar2 = uVar3;
      }
    }
    if ((byte *)ptr == (byte *)0x0) {
      unaff_R15 = (byte *)0x0;
      bVar6 = false;
    }
    else if (uVar2 == 0 || (uVar2 & 7) == 4) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar2 - 1;
      bVar6 = false;
      unaff_R15 = (byte *)ptr;
    }
    else {
      ptr = FieldParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                      ((ulong)uVar2,field_parser,ptr,ctx);
      bVar6 = (byte *)ptr != (byte *)0x0;
      if (!bVar6) {
        unaff_R15 = (byte *)0x0;
      }
    }
    if (!bVar6) {
      return (char *)unaff_R15;
    }
  } while( true );
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* WireFormatParser(T& field_parser,
                                                      const char* ptr,
                                                      ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32 tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}